

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMS_ECC_POINT_Unmarshal(TPMS_ECC_POINT *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_ECC_POINT *target_local;
  
  target_local._4_4_ = TPM2B_ECC_PARAMETER_Unmarshal(&target->x,buffer,size);
  if (target_local._4_4_ == 0) {
    target_local._4_4_ = TPM2B_ECC_PARAMETER_Unmarshal(&target->y,buffer,size);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMS_ECC_POINT_Unmarshal(TPMS_ECC_POINT *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM2B_ECC_PARAMETER_Unmarshal((TPM2B_ECC_PARAMETER *)&(target->x), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_ECC_PARAMETER_Unmarshal((TPM2B_ECC_PARAMETER *)&(target->y), buffer, size);
    return result;
}